

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::mouseMoveEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemModel *pQVar1;
  QPoint eventPosition;
  QPoint eventPosition_00;
  bool bVar2;
  State SVar3;
  uint uVar4;
  Int IVar5;
  QAbstractItemViewPrivate *this_00;
  QItemSelectionModel *pQVar6;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QRect selectionRect;
  SelectionFlags command;
  QPoint topLeft;
  QModelIndex buddy;
  QPersistentModelIndex index;
  QPoint bottomRight;
  undefined4 in_stack_fffffffffffffdf8;
  State in_stack_fffffffffffffdfc;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  QFlagsStorage<Qt::MouseButton> in_stack_fffffffffffffe0c;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe10;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined1 uVar7;
  bool local_1cb;
  byte local_1c9;
  byte local_1b9;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  byte bVar8;
  undefined4 local_174;
  QPersistentModelIndex local_170 [3];
  QPersistentModelIndex local_158 [6];
  Int local_124;
  undefined1 *local_120;
  undefined1 *local_118;
  QPersistentModelIndex local_110 [3];
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_f4;
  QPersistentModelIndex local_f0 [3];
  QFlagsStorageHelper<Qt::MouseButton,_4> local_d8;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_d4;
  QPoint local_d0;
  QPoint local_b0;
  QPoint local_a8;
  QPersistentModelIndex local_a0 [3];
  QPersistentModelIndex local_88 [3];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  QPersistentModelIndex local_40;
  QPoint local_38;
  QPoint local_30;
  QPoint local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x804adb);
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QSinglePointEvent::position((QSinglePointEvent *)0x804af9);
  local_10 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe10);
  local_30 = QAbstractItemViewPrivate::offset(in_stack_fffffffffffffe10);
  local_28 = ::operator+((QPoint *)in_stack_fffffffffffffe10,
                         (QPoint *)CONCAT44(in_stack_fffffffffffffe0c.i,in_stack_fffffffffffffe08));
  this_00->draggedPosition = local_28;
  SVar3 = state((QAbstractItemView *)in_stack_fffffffffffffe00);
  if ((SVar3 == ExpandingState) ||
     (SVar3 = state((QAbstractItemView *)in_stack_fffffffffffffe00), SVar3 == CollapsingState))
  goto LAB_0080519d;
  SVar3 = state((QAbstractItemView *)in_stack_fffffffffffffe00);
  if (SVar3 == DraggingState) {
    local_38 = local_10;
    eventPosition.yp.m_i._3_1_ = in_stack_fffffffffffffe5f;
    eventPosition._0_7_ = in_stack_fffffffffffffe58;
    QAbstractItemViewPrivate::maybeStartDrag
              ((QAbstractItemViewPrivate *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),eventPosition);
    goto LAB_0080519d;
  }
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x1f0))(local_58,in_RDI,&local_10);
  QPersistentModelIndex::QPersistentModelIndex(&local_40,(QModelIndex *)local_58);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this_00->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_88);
  (**(code **)(*(long *)pQVar1 + 0x148))(&local_70,pQVar1,local_88);
  SVar3 = state((QAbstractItemView *)in_stack_fffffffffffffe00);
  if (SVar3 == EditingState) {
    bVar2 = QAbstractItemViewPrivate::hasEditor
                      (in_stack_fffffffffffffe18,(QModelIndex *)in_stack_fffffffffffffe10);
    local_1b9 = 1;
    if (!bVar2) goto LAB_00804ca1;
  }
  else {
LAB_00804ca1:
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
    local_1b9 = (**(code **)(*in_RDI + 0x2e0))(in_RDI,local_a0,0,in_RSI);
  }
  if ((local_1b9 & 1) == 0) {
    local_a8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    if (this_00->selectionMode == SingleSelection) {
      local_a8 = local_10;
    }
    else {
      local_b0 = QAbstractItemViewPrivate::offset(in_stack_fffffffffffffe10);
      local_a8 = ::operator-((QPoint *)in_stack_fffffffffffffe10,
                             (QPoint *)
                             CONCAT44(in_stack_fffffffffffffe0c.i,in_stack_fffffffffffffe08));
    }
    QAbstractItemViewPrivate::checkMouseMove
              (in_stack_fffffffffffffe18,(QPersistentModelIndex *)in_stack_fffffffffffffe10);
    uVar4 = QPersistentModelIndex::isValid();
    bVar8 = 0;
    local_1c9 = 0;
    if (((uVar4 & 1) != 0) && (local_1c9 = 0, (this_00->dragEnabled & 1U) != 0)) {
      SVar3 = state((QAbstractItemView *)in_stack_fffffffffffffe00);
      local_1c9 = 0;
      if (SVar3 != DragSelectingState) {
        QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffe00);
        bVar2 = ::operator!=((QFlags<Qt::MouseButton>)in_stack_fffffffffffffe0c.i,
                             (MouseButton)in_stack_fffffffffffffe00);
        local_1c9 = 0;
        if (bVar2) {
          QAbstractItemViewPrivate::selectedDraggableIndexes
                    ((QAbstractItemViewPrivate *)
                     CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          bVar8 = 1;
          bVar2 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x804e07);
          local_1c9 = bVar2 ^ 0xff;
        }
      }
    }
    if ((bVar8 & 1) != 0) {
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x804e2b);
    }
    if ((local_1c9 & 1) == 0) {
      local_d8.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffe00);
      local_d4.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QFlags<Qt::MouseButton>::operator&
                     ((QFlags<Qt::MouseButton> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc
                     );
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
      local_1cb = false;
      if (IVar5 != 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
        uVar4 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                       super_QFramePrivate.super_QWidgetPrivate + 0x138))
                          (this_00,local_f0);
        local_1cb = false;
        if ((uVar4 & 1) != 0) {
          local_1cb = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x804f0c);
        }
      }
      if (local_1cb != false) {
        setState((QAbstractItemView *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        local_f4.i = 0xaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
        local_f4.i = (**(code **)(*in_RDI + 0x2e8))(in_RDI,local_110,in_RSI);
        if ((this_00->ctrlDragSelectionFlag != NoUpdate) &&
           (bVar2 = QFlags<QItemSelectionModel::SelectionFlag>::testFlag
                              ((QFlags<QItemSelectionModel::SelectionFlag> *)
                               in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc), bVar2)) {
          QFlags<QItemSelectionModel::SelectionFlag>::operator&=
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_f4,-9);
          QFlags<QItemSelectionModel::SelectionFlag>::operator|=
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_f4,
                     this_00->ctrlDragSelectionFlag);
        }
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                     (QPoint *)in_stack_fffffffffffffe18,(QPoint *)in_stack_fffffffffffffe10);
        local_124 = local_f4.i;
        (**(code **)(*in_RDI + 0x2c8))(in_RDI,&local_120,local_f4.i);
        uVar4 = QPersistentModelIndex::isValid();
        uVar7 = false;
        if ((uVar4 & 1) != 0) {
          QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x805053);
          QItemSelectionModel::currentIndex();
          bVar2 = ::operator!=((QPersistentModelIndex *)in_stack_fffffffffffffe00,
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          uVar7 = false;
          if (bVar2) {
            in_stack_fffffffffffffe18 = this_00;
            QPersistentModelIndex::operator_cast_to_QModelIndex(local_158);
            uVar7 = QAbstractItemViewPrivate::isIndexEnabled
                              (in_stack_fffffffffffffe00,
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          }
        }
        if ((bool)uVar7 == false) {
          QMouseEvent::pos((QMouseEvent *)this_00);
          bVar2 = QAbstractItemViewPrivate::shouldAutoScroll
                            ((QAbstractItemViewPrivate *)CONCAT17(uVar7,in_stack_fffffffffffffe20),
                             (QPoint *)in_stack_fffffffffffffe18);
          bVar8 = 0;
          if (bVar2) {
            bVar2 = QBasicTimer::isActive(&this_00->autoScrollTimer);
            bVar8 = bVar2 ^ 0xff;
          }
          if ((bVar8 & 1) != 0) {
            startAutoScroll((QAbstractItemView *)0x805184);
          }
        }
        else {
          pQVar6 = QPointer<QItemSelectionModel>::operator->
                             ((QPointer<QItemSelectionModel> *)0x8050d7);
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_170);
          QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdfc);
          (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,local_170,local_174);
        }
      }
    }
    else {
      setState((QAbstractItemView *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      local_d0 = local_10;
      eventPosition_00.yp.m_i._3_1_ = bVar8;
      eventPosition_00._0_7_ = in_stack_fffffffffffffe58;
      QAbstractItemViewPrivate::maybeStartDrag
                ((QAbstractItemViewPrivate *)
                 CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),eventPosition_00);
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_0080519d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    QPoint bottomRight = event->position().toPoint();

    d->draggedPosition = bottomRight + d->offset();

    if (state() == ExpandingState || state() == CollapsingState)
        return;

#if QT_CONFIG(draganddrop)
    if (state() == DraggingState) {
        d->maybeStartDrag(bottomRight);
        return;
    }
#endif // QT_CONFIG(draganddrop)

    QPersistentModelIndex index = indexAt(bottomRight);
    QModelIndex buddy = d->model->buddy(d->pressedIndex);
    if ((state() == EditingState && d->hasEditor(buddy))
        || edit(index, NoEditTriggers, event))
        return;

    const QPoint topLeft =
            d->selectionMode != SingleSelection ? d->pressedPosition - d->offset() : bottomRight;

    d->checkMouseMove(index);

#if QT_CONFIG(draganddrop)
    if (d->pressedIndex.isValid()
        && d->dragEnabled
        && (state() != DragSelectingState)
        && (event->buttons() != Qt::NoButton)
        && !d->selectedDraggableIndexes().isEmpty()) {
            setState(DraggingState);
            d->maybeStartDrag(bottomRight);
            return;
    }
#endif

    if ((event->buttons() & Qt::LeftButton) && d->selectionAllowed(index) && d->selectionModel) {
        setState(DragSelectingState);
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
        if (d->ctrlDragSelectionFlag != QItemSelectionModel::NoUpdate && command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            command |= d->ctrlDragSelectionFlag;
        }

        // Do the normalize ourselves, since QRect::normalized() is flawed
        QRect selectionRect = QRect(topLeft, bottomRight);
        setSelection(selectionRect, command);

        // set at the end because it might scroll the view
        if (index.isValid() && (index != d->selectionModel->currentIndex()) && d->isIndexEnabled(index))
            d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        else if (d->shouldAutoScroll(event->pos()) && !d->autoScrollTimer.isActive())
            startAutoScroll();
    }
}